

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdKelvinFdBeginPatchD::adjust_orig_mthd(MthdKelvinFdBeginPatchD *this)

{
  mt19937 *this_00;
  byte *pbVar1;
  uint32_t *puVar2;
  uint uVar3;
  result_type rVar4;
  int i;
  long lVar5;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    adjust_orig_idx(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
    pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             fd_state_unk30 + 1);
    *pbVar1 = *pbVar1 & 0xfb;
    this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
               super_Test.rnd;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2);
      *pbVar1 = *pbVar1 & 1;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_d;
        *(byte *)puVar2 = (byte)*puVar2 | 8;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.debug_fd_check_skip = 0;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_misc & 0xfeffff0f
             | 0xe0;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 3) != 0) {
        *(undefined1 *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 3) = 0x10;
      }
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_begin_patch_c =
           (uint)*(ushort *)
                  ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                          fd_state_begin_patch_c + 2) << 0x10;
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fd_state_begin_patch_c;
      *puVar2 = *puVar2 ^ 1 << ((byte)rVar4 & 0x1f);
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fd_state_begin_patch_c;
      *puVar2 = *puVar2 ^ 1 << ((byte)rVar4 & 0x1f);
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             (uint)*(ushort *)
                    ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                            fe3d_shadow_begin_patch_c + 2) << 0x10;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 1) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             ((uint)rVar4 & 1) << 0x15 | uVar3 & 0xfc1fffff;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 1) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                fe3d_shadow_begin_patch_c;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fe3d_shadow_begin_patch_c =
             ((uint)rVar4 & 1) << 0x1a | uVar3 & 0x83ffffff;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 1) != 0) {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                  fe3d_shadow_begin_patch_c;
        *puVar2 = *puVar2 ^ 1 << (sbyte)(rVar4 % 0x1f);
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        if ((rVar4 & 1) != 0) {
          rVar4 = std::
                  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  ::operator()(this_00);
          puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                    fe3d_shadow_begin_patch_c;
          *puVar2 = *puVar2 ^ 1 << (sbyte)(rVar4 % 0x1f);
        }
      }
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk1c =
             (uint)rVar4 & 1 | uVar3 & 0xffffffe0;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.fd_state_unk20 =
             ((uint)rVar4 & 1) << 0x1b | uVar3 & 0x7ffffff;
      }
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 3) != 0) {
      puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_valid;
      *puVar2 = *puVar2 | 0xc0c;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 3) != 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.surf_type =
           ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.surf_type & 0xfffffffc)
           + 1;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 0xf) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_dma_tex[0] =
           (uint)*(ushort *)
                  ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                         bundle_dma_tex + 2) << 0x10;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 0xf) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_dma_tex[1] =
           (uint)*(ushort *)
                  ((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                         bundle_dma_tex + 6) << 0x10;
    }
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 0xf) == 0) {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00);
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_tex_format[lVar5] =
             ((byte)"\f\x0e\x0f"[rVar4 % 3] & 0x7f) << 8 |
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_tex_format
             [lVar5] & 0xffff80ff;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                 bundle_tex_control_a + lVar5;
        *(byte *)puVar2 = (byte)*puVar2 & 0xf7;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                 bundle_tex_control_a + lVar5;
        *(byte *)puVar2 = (byte)*puVar2 & 0xcf;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                bundle_tex_control_a + lVar5 * 4 + 3);
        *pbVar1 = *pbVar1 | 0x40;
      }
    }
    for (lVar5 = 0;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(this_00), lVar5 != 8; lVar5 = lVar5 + 1) {
      if ((rVar4 & 7) != 0) {
        pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                bundle_rc_out_color + lVar5 * 4 + 2);
        *pbVar1 = *pbVar1 & 0xf3;
      }
    }
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_stencil_a;
        *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.bundle_blend;
        *(byte *)puVar2 = (byte)*puVar2 & 0xf7;
      }
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      if ((rVar4 & 7) != 0) {
        pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                                 bundle_config_a + 1);
        *pbVar1 = *pbVar1 & 0xbf;
      }
    }
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (chipset.card_type != 0x20)
			return;
		adjust_orig_idx(&orig);
		// Prevents things from blowing up...
		insrt(orig.fd_state_unk30, 10, 1, 0);
		if (rnd() & 1) {
			insrt(val, 17, 7, 0);
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.debug_d, 3, 1, 1);
			if (rnd() & 7)
				orig.debug_fd_check_skip = 0;
			if (rnd() & 7) {
				orig.fe3d_misc &= 0xfeffff0f;
				orig.fe3d_misc |= 0x000000e0;
			}
			if (rnd() & 3) {
				insrt(val, 24, 8, 0x10);
			}
		}
		if (rnd() & 1) {
			orig.fd_state_begin_patch_c &= 0xffff0000;
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
			orig.fd_state_begin_patch_c ^= 1 << (rnd() & 0x1f);
		}
		if (rnd() & 1) {
			if (rnd() & 1)
				orig.fe3d_shadow_begin_patch_c &= 0xffff0000;
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 21, 5, rnd() & 1);
			if (rnd() & 1)
				insrt(orig.fe3d_shadow_begin_patch_c, 26, 5, rnd() & 1);
			if (rnd() & 1) {
				orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
				if (rnd() & 1)
					orig.fe3d_shadow_begin_patch_c ^= 1 << (rnd() % 31);
			}
		}
		if (rnd() & 1) {
			if (rnd() & 7)
				insrt(orig.fd_state_unk1c, 0, 5, rnd() & 1);
			if (rnd() & 7)
				insrt(orig.fd_state_unk20, 27, 5, rnd() & 1);
		}
		adjust_orig_launch(&orig, rnd);
	}